

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall
picojson::default_parse_context::
parse_array_item<std::istreambuf_iterator<char,std::char_traits<char>>>
          (default_parse_context *this,
          input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in,size_t param_2)

{
  string *this_00;
  bool bVar1;
  runtime_error *this_01;
  int local_30;
  default_parse_context ctx;
  
  if (this->out_->type_ != 4) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"\"type mismatch! call is<type>() before get<type>()\" && is<array>()");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (this->out_->u_).string_;
  _local_30 = _local_30 & 0xffffffff00000000;
  std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
            ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00,
             (value *)&stack0xffffffffffffffd0);
  if (local_30 == 5) {
    if (ctx.out_ == (value *)0x0) goto LAB_00117910;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)ctx.out_);
  }
  else if (local_30 == 4) {
    if (ctx.out_ == (value *)0x0) goto LAB_00117910;
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)ctx.out_);
  }
  else {
    if ((local_30 != 3) || (ctx.out_ == (value *)0x0)) goto LAB_00117910;
    if (*ctx.out_ != ctx.out_ + 1) {
      operator_delete(*ctx.out_);
    }
  }
  operator_delete(ctx.out_);
LAB_00117910:
  _local_30 = (pointer)this_00->_M_string_length + -1;
  bVar1 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    ((default_parse_context *)&stack0xffffffffffffffd0,in);
  return bVar1;
}

Assistant:

bool parse_array_item(input<Iter>& in, size_t) {
      array& a = out_->get<array>();
      a.push_back(value());
      default_parse_context ctx(&a.back());
      return _parse(ctx, in);
    }